

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_entropy_coded_data(stbi__jpeg *z)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  stbi__jpeg *in_RDI;
  short *data_3;
  int y2_1;
  int x2_1;
  int n_3;
  int y_1;
  int x_1;
  int k_1;
  int j_3;
  int i_3;
  int ha_2;
  short *data_2;
  int h_1;
  int w_1;
  int n_2;
  int j_2;
  int i_2;
  int ha_1;
  int y2;
  int x2;
  int n_1;
  short data_1 [64];
  int y;
  int x;
  int k;
  int j_1;
  int i_1;
  int ha;
  int h;
  int w;
  int n;
  short data [64];
  int j;
  int i;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  stbi__huffman *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int local_190;
  int in_stack_fffffffffffffe74;
  int iVar7;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  stbi__huffman *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int local_160;
  int local_15c;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  short local_148 [70];
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  short local_98 [64];
  int local_18;
  int local_14;
  stbi__jpeg *local_10;
  
  local_10 = in_RDI;
  stbi__jpeg_reset(in_RDI);
  if (local_10->progressive == 0) {
    if (local_10->scan_n == 1) {
      local_9c = local_10->order[0];
      local_a0 = local_10->img_comp[local_9c].x + 7 >> 3;
      local_a4 = local_10->img_comp[local_9c].y + 7 >> 3;
      for (local_18 = 0; local_18 < local_a4; local_18 = local_18 + 1) {
        for (local_14 = 0; local_14 < local_a0; local_14 = local_14 + 1) {
          local_a8 = local_10->img_comp[local_9c].ha;
          iVar1 = stbi__jpeg_decode_block
                            ((stbi__jpeg *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                             (short *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             in_stack_fffffffffffffe88,
                             (stbi__huffman *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             (stbi__int16 *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                             in_stack_fffffffffffffe74,
                             (stbi__uint16 *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          if (iVar1 == 0) {
            return 0;
          }
          (*local_10->idct_block_kernel)
                    (local_10->img_comp[local_9c].data +
                     (long)(local_14 << 3) + (long)(local_10->img_comp[local_9c].w2 * local_18 * 8),
                     local_10->img_comp[local_9c].w2,local_98);
          iVar1 = local_10->todo + -1;
          local_10->todo = iVar1;
          if (iVar1 < 1) {
            if (local_10->code_bits < 0x18) {
              stbi__grow_buffer_unsafe
                        ((stbi__jpeg *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                        );
            }
            if ((local_10->marker < 0xd0) || (0xd7 < local_10->marker)) {
              return 1;
            }
            stbi__jpeg_reset(local_10);
          }
        }
      }
    }
    else {
      for (local_b0 = 0; local_b0 < local_10->img_mcu_y; local_b0 = local_b0 + 1) {
        for (local_ac = 0; local_ac < local_10->img_mcu_x; local_ac = local_ac + 1) {
          for (local_b4 = 0; local_b4 < local_10->scan_n; local_b4 = local_b4 + 1) {
            iVar1 = local_10->order[local_b4];
            for (local_bc = 0; local_bc < local_10->img_comp[iVar1].v; local_bc = local_bc + 1) {
              for (local_b8 = 0; local_b8 < local_10->img_comp[iVar1].h; local_b8 = local_b8 + 1) {
                iVar2 = (local_ac * local_10->img_comp[iVar1].h + local_b8) * 8;
                iVar3 = local_b0 * local_10->img_comp[iVar1].v + local_bc;
                iVar4 = stbi__jpeg_decode_block
                                  ((stbi__jpeg *)
                                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                   (short *)CONCAT44(in_stack_fffffffffffffe94,
                                                     in_stack_fffffffffffffe90),
                                   in_stack_fffffffffffffe88,
                                   (stbi__huffman *)
                                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                   (stbi__int16 *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                   in_stack_fffffffffffffe74,(stbi__uint16 *)CONCAT44(iVar1,iVar2));
                if (iVar4 == 0) {
                  return 0;
                }
                (*local_10->idct_block_kernel)
                          (local_10->img_comp[iVar1].data +
                           (long)iVar2 + (long)(local_10->img_comp[iVar1].w2 * iVar3 * 8),
                           local_10->img_comp[iVar1].w2,local_148);
              }
            }
          }
          iVar1 = local_10->todo + -1;
          local_10->todo = iVar1;
          if (iVar1 < 1) {
            if (local_10->code_bits < 0x18) {
              stbi__grow_buffer_unsafe
                        ((stbi__jpeg *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                        );
            }
            if ((local_10->marker < 0xd0) || (0xd7 < local_10->marker)) {
              return 1;
            }
            stbi__jpeg_reset(local_10);
          }
        }
      }
    }
  }
  else if (local_10->scan_n == 1) {
    iVar1 = local_10->order[0];
    iVar2 = local_10->img_comp[iVar1].x + 7 >> 3;
    iVar3 = local_10->img_comp[iVar1].y + 7 >> 3;
    for (local_160 = 0; local_160 < iVar3; local_160 = local_160 + 1) {
      for (local_15c = 0; local_15c < iVar2; local_15c = local_15c + 1) {
        if (local_10->spec_start == 0) {
          iVar4 = stbi__jpeg_decode_block_prog_dc
                            ((stbi__jpeg *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                             (short *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
          if (iVar4 == 0) {
            return 0;
          }
        }
        else {
          iVar4 = stbi__jpeg_decode_block_prog_ac
                            ((stbi__jpeg *)CONCAT44(iVar1,iVar2),
                             (short *)CONCAT44(iVar3,in_stack_fffffffffffffe90),
                             (stbi__huffman *)
                             (local_10->img_comp[iVar1].coeff +
                             (local_15c + local_160 * local_10->img_comp[iVar1].coeff_w) * 0x40),
                             (stbi__int16 *)
                             CONCAT44(local_10->img_comp[iVar1].ha,in_stack_fffffffffffffe80));
          if (iVar4 == 0) {
            return 0;
          }
        }
        iVar4 = local_10->todo + -1;
        local_10->todo = iVar4;
        if (iVar4 < 1) {
          if (local_10->code_bits < 0x18) {
            stbi__grow_buffer_unsafe
                      ((stbi__jpeg *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          }
          if ((local_10->marker < 0xd0) || (0xd7 < local_10->marker)) {
            return 1;
          }
          stbi__jpeg_reset(local_10);
        }
      }
    }
  }
  else {
    for (iVar1 = 0; iVar1 < local_10->img_mcu_y; iVar1 = iVar1 + 1) {
      for (iVar2 = 0; iVar2 < local_10->img_mcu_x; iVar2 = iVar2 + 1) {
        for (iVar3 = 0; iVar3 < local_10->scan_n; iVar3 = iVar3 + 1) {
          iVar4 = local_10->order[iVar3];
          for (local_190 = 0; local_190 < local_10->img_comp[iVar4].v; local_190 = local_190 + 1) {
            for (iVar7 = 0; iVar7 < local_10->img_comp[iVar4].h; iVar7 = iVar7 + 1) {
              iVar5 = iVar2 * local_10->img_comp[iVar4].h + iVar7;
              iVar6 = iVar1 * local_10->img_comp[iVar4].v + local_190;
              iVar5 = stbi__jpeg_decode_block_prog_dc
                                ((stbi__jpeg *)CONCAT44(iVar4,iVar5),
                                 (short *)CONCAT44(iVar6,in_stack_fffffffffffffe60),
                                 (stbi__huffman *)
                                 (local_10->img_comp[iVar4].coeff +
                                 (iVar5 + iVar6 * local_10->img_comp[iVar4].coeff_w) * 0x40),
                                 in_stack_fffffffffffffe54);
              if (iVar5 == 0) {
                return 0;
              }
            }
          }
        }
        iVar3 = local_10->todo + -1;
        local_10->todo = iVar3;
        if (iVar3 < 1) {
          if (local_10->code_bits < 0x18) {
            stbi__grow_buffer_unsafe
                      ((stbi__jpeg *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          }
          if ((local_10->marker < 0xd0) || (0xd7 < local_10->marker)) {
            return 1;
          }
          stbi__jpeg_reset(local_10);
        }
      }
    }
  }
  return 1;
}

Assistant:

static int stbi__parse_entropy_coded_data(stbi__jpeg *z)
{
   stbi__jpeg_reset(z);
   if (!z->progressive) {
      if (z->scan_n == 1) {
         int i,j;
         STBI_SIMD_ALIGN(short, data[64]);
         int n = z->order[0];
         // non-interleaved data, we just need to process one block at a time,
         // in trivial scanline order
         // number of blocks to do just depends on how many actual "pixels" this
         // component has, independent of interleaved MCU blocking and such
         int w = (z->img_comp[n].x+7) >> 3;
         int h = (z->img_comp[n].y+7) >> 3;
         for (j=0; j < h; ++j) {
            for (i=0; i < w; ++i) {
               int ha = z->img_comp[n].ha;
               if (!stbi__jpeg_decode_block(z, data, z->huff_dc+z->img_comp[n].hd, z->huff_ac+ha, z->fast_ac[ha], n, z->dequant[z->img_comp[n].tq])) return 0;
               z->idct_block_kernel(z->img_comp[n].data+z->img_comp[n].w2*j*8+i*8, z->img_comp[n].w2, data);
               // every data block is an MCU, so countdown the restart interval
               if (--z->todo <= 0) {
                  if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                  // if it's NOT a restart, then just bail, so we get corrupt data
                  // rather than no data
                  if (!STBI__RESTART(z->marker)) return 1;
                  stbi__jpeg_reset(z);
               }
            }
         }
         return 1;
      } else { // interleaved
         int i,j,k,x,y;
         STBI_SIMD_ALIGN(short, data[64]);
         for (j=0; j < z->img_mcu_y; ++j) {
            for (i=0; i < z->img_mcu_x; ++i) {
               // scan an interleaved mcu... process scan_n components in order
               for (k=0; k < z->scan_n; ++k) {
                  int n = z->order[k];
                  // scan out an mcu's worth of this component; that's just determined
                  // by the basic H and V specified for the component
                  for (y=0; y < z->img_comp[n].v; ++y) {
                     for (x=0; x < z->img_comp[n].h; ++x) {
                        int x2 = (i*z->img_comp[n].h + x)*8;
                        int y2 = (j*z->img_comp[n].v + y)*8;
                        int ha = z->img_comp[n].ha;
                        if (!stbi__jpeg_decode_block(z, data, z->huff_dc+z->img_comp[n].hd, z->huff_ac+ha, z->fast_ac[ha], n, z->dequant[z->img_comp[n].tq])) return 0;
                        z->idct_block_kernel(z->img_comp[n].data+z->img_comp[n].w2*y2+x2, z->img_comp[n].w2, data);
                     }
                  }
               }
               // after all interleaved components, that's an interleaved MCU,
               // so now count down the restart interval
               if (--z->todo <= 0) {
                  if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                  if (!STBI__RESTART(z->marker)) return 1;
                  stbi__jpeg_reset(z);
               }
            }
         }
         return 1;
      }
   } else {
      if (z->scan_n == 1) {
         int i,j;
         int n = z->order[0];
         // non-interleaved data, we just need to process one block at a time,
         // in trivial scanline order
         // number of blocks to do just depends on how many actual "pixels" this
         // component has, independent of interleaved MCU blocking and such
         int w = (z->img_comp[n].x+7) >> 3;
         int h = (z->img_comp[n].y+7) >> 3;
         for (j=0; j < h; ++j) {
            for (i=0; i < w; ++i) {
               short *data = z->img_comp[n].coeff + 64 * (i + j * z->img_comp[n].coeff_w);
               if (z->spec_start == 0) {
                  if (!stbi__jpeg_decode_block_prog_dc(z, data, &z->huff_dc[z->img_comp[n].hd], n))
                     return 0;
               } else {
                  int ha = z->img_comp[n].ha;
                  if (!stbi__jpeg_decode_block_prog_ac(z, data, &z->huff_ac[ha], z->fast_ac[ha]))
                     return 0;
               }
               // every data block is an MCU, so countdown the restart interval
               if (--z->todo <= 0) {
                  if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                  if (!STBI__RESTART(z->marker)) return 1;
                  stbi__jpeg_reset(z);
               }
            }
         }
         return 1;
      } else { // interleaved
         int i,j,k,x,y;
         for (j=0; j < z->img_mcu_y; ++j) {
            for (i=0; i < z->img_mcu_x; ++i) {
               // scan an interleaved mcu... process scan_n components in order
               for (k=0; k < z->scan_n; ++k) {
                  int n = z->order[k];
                  // scan out an mcu's worth of this component; that's just determined
                  // by the basic H and V specified for the component
                  for (y=0; y < z->img_comp[n].v; ++y) {
                     for (x=0; x < z->img_comp[n].h; ++x) {
                        int x2 = (i*z->img_comp[n].h + x);
                        int y2 = (j*z->img_comp[n].v + y);
                        short *data = z->img_comp[n].coeff + 64 * (x2 + y2 * z->img_comp[n].coeff_w);
                        if (!stbi__jpeg_decode_block_prog_dc(z, data, &z->huff_dc[z->img_comp[n].hd], n))
                           return 0;
                     }
                  }
               }
               // after all interleaved components, that's an interleaved MCU,
               // so now count down the restart interval
               if (--z->todo <= 0) {
                  if (z->code_bits < 24) stbi__grow_buffer_unsafe(z);
                  if (!STBI__RESTART(z->marker)) return 1;
                  stbi__jpeg_reset(z);
               }
            }
         }
         return 1;
      }
   }
}